

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

App * __thiscall CLI::App::ignore_case(App *this,bool value)

{
  bool bVar1;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *this_00;
  pointer pAVar2;
  OptionAlreadyAdded *this_01;
  bool local_d9;
  bool local_c9;
  string local_b8;
  byte local_91;
  string local_90;
  byte local_59;
  string local_58;
  unique_ptr<CLI::App,_std::default_delete<CLI::App>_> *local_38;
  unique_ptr<CLI::App,_std::default_delete<CLI::App>_> *subc;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *__range3;
  bool value_local;
  App *this_local;
  
  this->ignore_case_ = value;
  if (this->parent_ != (App *)0x0) {
    this_00 = &this->parent_->subcommands_;
    __end3 = std::
             vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ::begin(this_00);
    subc = (unique_ptr<CLI::App,_std::default_delete<CLI::App>_> *)
           std::
           vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                                       *)&subc), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                 ::operator*(&__end3);
      pAVar2 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::get(local_38);
      local_59 = 0;
      local_91 = 0;
      local_c9 = false;
      if (pAVar2 != this) {
        pAVar2 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_38);
        ::std::__cxx11::string::string((string *)&local_58,(string *)&pAVar2->name_);
        local_59 = 1;
        bVar1 = check_name(this,&local_58);
        local_d9 = true;
        if (!bVar1) {
          pAVar2 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_38);
          ::std::__cxx11::string::string((string *)&local_90,(string *)&this->name_);
          local_91 = 1;
          local_d9 = check_name(pAVar2,&local_90);
        }
        local_c9 = local_d9;
      }
      if ((local_91 & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_90);
      }
      if ((local_59 & 1) != 0) {
        ::std::__cxx11::string::~string((string *)&local_58);
      }
      if (local_c9 != false) {
        this_01 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        pAVar2 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_38);
        ::std::__cxx11::string::string((string *)&local_b8,(string *)&pAVar2->name_);
        OptionAlreadyAdded::OptionAlreadyAdded(this_01,&local_b8);
        __cxa_throw(this_01,&OptionAlreadyAdded::typeinfo,OptionAlreadyAdded::~OptionAlreadyAdded);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  return this;
}

Assistant:

App *ignore_case(bool value = true) {
        ignore_case_ = value;
        if(parent_ != nullptr) {
            for(const auto &subc : parent_->subcommands_) {
                if(subc.get() != this && (this->check_name(subc->name_) || subc->check_name(this->name_)))
                    throw OptionAlreadyAdded(subc->name_);
            }
        }
        return this;
    }